

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void upb_Map_SetEntryValue(upb_Map *map,size_t iter,upb_MessageValue val)

{
  upb_value v;
  upb_value local_30;
  double local_28;
  size_t local_20;
  
  local_20 = val.str_val.size;
  local_28 = val.double_val;
  memcpy(&local_30,&local_28,(long)map->val_size);
  if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
    upb_strtable_setentryvalue(&(map->t).strtable,iter,local_30);
    return;
  }
  upb_inttable_setentryvalue(&(map->t).inttable,iter,local_30);
  return;
}

Assistant:

UPB_API void upb_Map_SetEntryValue(upb_Map* map, size_t iter,
                                   upb_MessageValue val) {
  upb_value v;
  _upb_map_tovalue(&val, map->val_size, &v, NULL);
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_strtable_setentryvalue(&map->t.strtable, iter, v);
  } else {
    upb_inttable_setentryvalue(&map->t.inttable, iter, v);
  }
}